

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall cmDependsFortran::FindModule(cmDependsFortran *this,string *name,string *module)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  string fullName;
  string mod_lower;
  string mod_upper;
  
  cmsys::SystemTools::UpperCase(&mod_upper,name);
  std::__cxx11::string::string((string *)&mod_lower,(string *)name);
  std::__cxx11::string::append((char *)&mod_upper);
  std::__cxx11::string::append((char *)&mod_lower);
  fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
  fullName._M_string_length = 0;
  fullName.field_2._M_local_buf[0] = '\0';
  pbVar2 = (this->super_cmDepends).IncludePath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    pbVar1 = (this->super_cmDepends).IncludePath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 == pbVar1) goto LAB_002621f6;
    std::__cxx11::string::_M_assign((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((string *)&fullName);
    bVar3 = cmsys::SystemTools::FileExists(fullName._M_dataplus._M_p,true);
    if (bVar3) break;
    std::__cxx11::string::_M_assign((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((string *)&fullName);
    bVar3 = cmsys::SystemTools::FileExists(fullName._M_dataplus._M_p,true);
    pbVar2 = pbVar4 + 1;
  } while (!bVar3);
  std::__cxx11::string::_M_assign((string *)module);
LAB_002621f6:
  std::__cxx11::string::~string((string *)&fullName);
  std::__cxx11::string::~string((string *)&mod_lower);
  std::__cxx11::string::~string((string *)&mod_upper);
  return pbVar4 != pbVar1;
}

Assistant:

bool cmDependsFortran::FindModule(std::string const& name,
                                  std::string& module)
{
  // Construct possible names for the module file.
  std::string mod_upper = cmSystemTools::UpperCase(name);
  std::string mod_lower = name;
  mod_upper += ".mod";
  mod_lower += ".mod";

  // Search the include path for the module.
  std::string fullName;
  for(std::vector<std::string>::const_iterator i =
        this->IncludePath.begin(); i != this->IncludePath.end(); ++i)
    {
    // Try the lower-case name.
    fullName = *i;
    fullName += "/";
    fullName += mod_lower;
    if(cmSystemTools::FileExists(fullName.c_str(), true))
      {
      module = fullName;
      return true;
      }

    // Try the upper-case name.
    fullName = *i;
    fullName += "/";
    fullName += mod_upper;
    if(cmSystemTools::FileExists(fullName.c_str(), true))
      {
      module = fullName;
      return true;
      }
    }
  return false;
}